

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * __thiscall
QLocaleData::signPrefix(QString *__return_storage_ptr__,QLocaleData *this,bool negative,uint flags)

{
  DataRange range;
  QueryType type;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,negative) == 0) {
    if ((flags & 0x10) == 0) {
      if ((flags & 8) == 0) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      QString::QString(__return_storage_ptr__,(QChar *)0x582978,1);
      return __return_storage_ptr__;
    }
    range = (DataRange)((ulong)this->m_plus_size << 0x20 | (ulong)this->m_plus_idx);
    type = PositiveSign;
  }
  else {
    range = (DataRange)((ulong)this->m_minus_size << 0x20 | (ulong)this->m_minus_idx);
    type = NegativeSign;
  }
  localeString(__return_storage_ptr__,this,type,range);
  return __return_storage_ptr__;
}

Assistant:

QString QLocaleData::signPrefix(bool negative, unsigned flags) const
{
    if (negative)
        return negativeSign();
    if (flags & AlwaysShowSign)
        return positiveSign();
    if (flags & BlankBeforePositive)
        return QStringView(u" ").toString();
    return {};
}